

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall miniros::Subscription::addLocalConnection(Subscription *this,PublicationPtr *pub)

{
  Publication *this_00;
  element_type *this_01;
  TransportHints *__args_2;
  long in_RDI;
  IntraProcessSubscriberLinkPtr sub_link;
  IntraProcessPublisherLinkPtr pub_link;
  bool enabled;
  scoped_lock<std::mutex> lock;
  char *in_stack_fffffffffffffef8;
  Subscription *in_stack_ffffffffffffff00;
  LogLocation *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  LogLocation *in_stack_ffffffffffffff30;
  shared_ptr<miniros::Subscription> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Level LVar1;
  undefined4 in_stack_ffffffffffffff44;
  allocator<char> local_51;
  string local_50 [52];
  undefined4 local_1c;
  
  LVar1 = (Level)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff00,
             (mutex_type *)in_stack_fffffffffffffef8);
  if ((*(byte *)(in_RDI + 0xe4) & 1) == 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((addLocalConnection::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (char *)in_stack_ffffffffffffff38,(allocator<char> *)in_stack_ffffffffffffff30);
      console::initializeLogLocation(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,LVar1);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    if (addLocalConnection::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_ffffffffffffff00,
                 (Level)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      console::checkLogLocationEnabled(in_stack_ffffffffffffff10);
    }
    if ((addLocalConnection::loc.logger_enabled_ & 1U) != 0) {
      in_stack_ffffffffffffff38 =
           (shared_ptr<miniros::Subscription> *)addLocalConnection::loc.logger_;
      LVar1 = addLocalConnection::loc.level_;
      in_stack_ffffffffffffff00 = (Subscription *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffef8 = "Creating intraprocess link for topic [%s]";
      console::print((FilterBase *)0x0,in_stack_ffffffffffffff38,(Level)(ulong)LVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0xc5,"void miniros::Subscription::addLocalConnection(const PublicationPtr &)")
      ;
    }
    std::enable_shared_from_this<miniros::Subscription>::shared_from_this
              ((enable_shared_from_this<miniros::Subscription> *)in_stack_fffffffffffffef8);
    this_00 = (Publication *)RPCManager::instance();
    this_01 = std::
              __shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4d0557);
    __args_2 = (TransportHints *)RPCManager::getServerURI_abi_cxx11_(this_01);
    std::
    make_shared<miniros::IntraProcessPublisherLink,std::shared_ptr<miniros::Subscription>,std::__cxx11::string_const&,miniros::TransportHints&>
              (in_stack_ffffffffffffff38,&this_00->name_,__args_2);
    std::shared_ptr<miniros::Subscription>::~shared_ptr
              ((shared_ptr<miniros::Subscription> *)0x4d059b);
    std::
    make_shared<miniros::IntraProcessSubscriberLink,std::shared_ptr<miniros::Publication>const&>
              ((shared_ptr<miniros::Publication> *)__args_2);
    std::
    __shared_ptr_access<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d05bf);
    IntraProcessPublisherLink::setPublisher
              ((IntraProcessPublisherLink *)this,(IntraProcessSubscriberLinkPtr *)pub);
    std::
    __shared_ptr_access<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d05de);
    IntraProcessSubscriberLink::setSubscriber
              ((IntraProcessSubscriberLink *)in_stack_ffffffffffffff00,
               (IntraProcessPublisherLinkPtr *)in_stack_fffffffffffffef8);
    std::shared_ptr<miniros::PublisherLink>::shared_ptr<miniros::IntraProcessPublisherLink,void>
              ((shared_ptr<miniros::PublisherLink> *)in_stack_ffffffffffffff00,
               (shared_ptr<miniros::IntraProcessPublisherLink> *)in_stack_fffffffffffffef8);
    addPublisherLink(in_stack_ffffffffffffff00,(PublisherLinkPtr *)in_stack_fffffffffffffef8);
    std::shared_ptr<miniros::PublisherLink>::~shared_ptr
              ((shared_ptr<miniros::PublisherLink> *)0x4d0622);
    std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4d062f);
    std::shared_ptr<miniros::SubscriberLink>::shared_ptr<miniros::IntraProcessSubscriberLink,void>
              ((shared_ptr<miniros::SubscriberLink> *)in_stack_ffffffffffffff00,
               (shared_ptr<miniros::IntraProcessSubscriberLink> *)in_stack_fffffffffffffef8);
    Publication::addSubscriberLink(this_00,(SubscriberLinkPtr *)__args_2);
    std::shared_ptr<miniros::SubscriberLink>::~shared_ptr
              ((shared_ptr<miniros::SubscriberLink> *)0x4d0666);
    std::shared_ptr<miniros::IntraProcessSubscriberLink>::~shared_ptr
              ((shared_ptr<miniros::IntraProcessSubscriberLink> *)0x4d0673);
    std::shared_ptr<miniros::IntraProcessPublisherLink>::~shared_ptr
              ((shared_ptr<miniros::IntraProcessPublisherLink> *)0x4d0680);
    local_1c = 0;
  }
  else {
    local_1c = 1;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d0698);
  return;
}

Assistant:

void Subscription::addLocalConnection(const PublicationPtr& pub)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
  if (dropped_)
  {
    return;
  }

  MINIROS_DEBUG("Creating intraprocess link for topic [%s]", name_.c_str());

  IntraProcessPublisherLinkPtr pub_link(std::make_shared<IntraProcessPublisherLink>(shared_from_this(), RPCManager::instance()->getServerURI(), transport_hints_));
  IntraProcessSubscriberLinkPtr sub_link(std::make_shared<IntraProcessSubscriberLink>(pub));
  pub_link->setPublisher(sub_link);
  sub_link->setSubscriber(pub_link);

  addPublisherLink(pub_link);
  pub->addSubscriberLink(sub_link);
}